

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O3

int __thiscall
btGeneric6DofSpring2Constraint::setAngularLimits
          (btGeneric6DofSpring2Constraint *this,btConstraintInfo2 *info,int row_offset,
          btTransform *transA,btTransform *transB,btVector3 *linVelA,btVector3 *linVelB,
          btVector3 *angVelA,btVector3 *angVelB)

{
  btRotationalLimitMotor2 *limot;
  uint uVar1;
  int iVar2;
  int ii;
  long lVar3;
  int local_68 [4];
  btTransform *local_58;
  btTransform *local_50;
  btVector3 *local_48;
  btVector3 axis;
  
  local_68[0] = 0;
  local_68[1] = 1;
  local_68[2] = 2;
  switch(this->m_rotateOrder) {
  case RO_XYZ:
    local_68[0] = 0;
    local_68[2] = 2;
    break;
  case RO_XZY:
    local_68[0] = 0;
    local_68[2] = 1;
    goto LAB_00194451;
  case RO_YXZ:
    local_68[0] = 1;
    local_68[2] = 2;
    goto LAB_00194436;
  case RO_YZX:
    local_68[0] = 1;
    local_68[2] = 0;
LAB_00194451:
    local_68[1] = 2;
    goto LAB_00194466;
  case RO_ZXY:
    local_68[0] = 2;
    local_68[2] = 1;
LAB_00194436:
    local_68[1] = 0;
    goto LAB_00194466;
  case RO_ZYX:
    local_68[0] = 2;
    local_68[2] = 0;
    break;
  default:
    goto switchD_0019440c_default;
  }
  local_68[1] = 1;
LAB_00194466:
switchD_0019440c_default:
  lVar3 = 0;
  local_58 = transA;
  local_50 = transB;
  local_48 = linVelA;
  do {
    iVar2 = local_68[lVar3];
    limot = this->m_angularLimits + iVar2;
    if (((this->m_angularLimits[iVar2].m_currentLimit != 0) || (limot->m_enableMotor != false)) ||
       (limot->m_enableSpring == true)) {
      axis.m_floats._0_8_ = *(undefined8 *)this->m_calculatedAxis[iVar2].m_floats;
      axis.m_floats._8_8_ = *(undefined8 *)(this->m_calculatedAxis[iVar2].m_floats + 2);
      uVar1 = this->m_flags >> ((char)iVar2 * '\x04' + 0xcU & 0x1f);
      if ((uVar1 & 1) == 0) {
        limot->m_stopCFM = *info->cfm;
      }
      if ((uVar1 & 2) == 0) {
        limot->m_stopERP = info->erp;
      }
      if ((uVar1 & 4) == 0) {
        limot->m_motorCFM = *info->cfm;
      }
      if ((uVar1 & 8) == 0) {
        limot->m_motorERP = info->erp;
      }
      iVar2 = get_limit_motor_info2
                        (this,limot,local_58,local_50,local_48,linVelB,angVelA,angVelB,info,
                         row_offset,&axis,1,0);
      row_offset = iVar2 + row_offset;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  return row_offset;
}

Assistant:

int btGeneric6DofSpring2Constraint::setAngularLimits(btConstraintInfo2 *info, int row_offset, const btTransform& transA,const btTransform& transB,const btVector3& linVelA,const btVector3& linVelB,const btVector3& angVelA,const btVector3& angVelB)
{
	int row = row_offset;

	//order of rotational constraint rows
	int cIdx[] = {0, 1, 2};
	switch(m_rotateOrder)
	{
		case RO_XYZ : cIdx[0] = 0; cIdx[1] = 1; cIdx[2] = 2; break;
		case RO_XZY : cIdx[0] = 0; cIdx[1] = 2; cIdx[2] = 1; break;
		case RO_YXZ : cIdx[0] = 1; cIdx[1] = 0; cIdx[2] = 2; break;
		case RO_YZX : cIdx[0] = 1; cIdx[1] = 2; cIdx[2] = 0; break;
		case RO_ZXY : cIdx[0] = 2; cIdx[1] = 0; cIdx[2] = 1; break;
		case RO_ZYX : cIdx[0] = 2; cIdx[1] = 1; cIdx[2] = 0; break;
		default : btAssert(false);
	}

	for (int ii = 0; ii < 3 ; ii++ )
	{
		int i = cIdx[ii];
		if(m_angularLimits[i].m_currentLimit || m_angularLimits[i].m_enableMotor || m_angularLimits[i].m_enableSpring)
		{
			btVector3 axis = getAxis(i);
			int flags = m_flags >> ((i + 3) * BT_6DOF_FLAGS_AXIS_SHIFT2);
			if(!(flags & BT_6DOF_FLAGS_CFM_STOP2))
			{
				m_angularLimits[i].m_stopCFM = info->cfm[0];
			}
			if(!(flags & BT_6DOF_FLAGS_ERP_STOP2))
			{
				m_angularLimits[i].m_stopERP = info->erp;
			}
			if(!(flags & BT_6DOF_FLAGS_CFM_MOTO2))
			{
				m_angularLimits[i].m_motorCFM = info->cfm[0];
			}
			if(!(flags & BT_6DOF_FLAGS_ERP_MOTO2))
			{
				m_angularLimits[i].m_motorERP = info->erp;
			}
			row += get_limit_motor_info2(&m_angularLimits[i],transA,transB,linVelA,linVelB,angVelA,angVelB, info,row,axis,1);
		}
	}

	return row;
}